

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

bool qUnregisterResourceData(int version,uchar *tree,uchar *name,uchar *data)

{
  qsizetype *pqVar1;
  QAtomicInt *pQVar2;
  QResourceRoot **ppQVar3;
  QResourceRoot *pQVar4;
  Data *pDVar5;
  QResourceRoot **ppQVar6;
  Type *this;
  Type *pTVar7;
  ResourceList *this_00;
  int iVar8;
  QResourceRoot **__src;
  undefined4 in_register_0000003c;
  long lVar9;
  bool bVar10;
  QDeadlineTimer timeout;
  
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    bVar10 = false;
  }
  else {
    this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>::
           operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                       *)CONCAT44(in_register_0000003c,version));
    timeout.t2 = 0;
    timeout.type = 1;
    timeout.t1 = 0x7fffffffffffffff;
    pTVar7 = this;
    QRecursiveMutex::tryLock(&this->resourceMutex,timeout);
    bVar10 = version - 1U < 3;
    if ((bVar10) &&
       (pTVar7 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                 ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                               *)pTVar7), (pTVar7->resourceList).d.size != 0)) {
      this_00 = &pTVar7->resourceList;
      lVar9 = 0;
      iVar8 = 0;
      do {
        pQVar4 = (pTVar7->resourceList).d.ptr[lVar9];
        if ((((pQVar4->tree == tree) && (pQVar4->names == name)) && (pQVar4->payloads == data)) &&
           (pQVar4->version == version)) {
          pDVar5 = (this_00->d).d;
          if ((pDVar5 == (Data *)0x0) ||
             (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*>::reallocateAndGrow
                      (&this_00->d,GrowsAtEnd,0,
                       (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
                       (ulong)(uint)version);
          }
          pDVar5 = (pTVar7->resourceList).d.d;
          pQVar4 = (pTVar7->resourceList).d.ptr[lVar9];
          if ((pDVar5 == (Data *)0x0) ||
             (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*>::reallocateAndGrow
                      (&this_00->d,GrowsAtEnd,0,
                       (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)pQVar4);
          }
          ppQVar6 = (pTVar7->resourceList).d.ptr;
          __src = ppQVar6 + lVar9 + 1;
          ppQVar3 = ppQVar6 + (pTVar7->resourceList).d.size;
          if ((iVar8 == 0) && (__src != ppQVar3)) {
            (pTVar7->resourceList).d.ptr = __src;
          }
          else if (__src != ppQVar3) {
            memmove(ppQVar6 + lVar9,__src,(long)ppQVar3 - (long)__src);
          }
          pqVar1 = &(pTVar7->resourceList).d.size;
          *pqVar1 = *pqVar1 + -1;
          LOCK();
          pQVar2 = &pQVar4->ref;
          (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (pQVar4 != (QResourceRoot *)0x0 &&
              (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*(code *)(((Data *)pQVar4->_vptr_QResourceRoot)->super_QArrayData).alloc)();
          }
        }
        else {
          iVar8 = iVar8 + 1;
        }
        lVar9 = (long)iVar8;
      } while (lVar9 < (pTVar7->resourceList).d.size);
    }
    QRecursiveMutex::unlock(&this->resourceMutex);
  }
  return bVar10;
}

Assistant:

Q_CORE_EXPORT bool qUnregisterResourceData(int version, const unsigned char *tree,
                                           const unsigned char *name, const unsigned char *data)
{
    if (resourceGlobalData.isDestroyed())
        return false;

    const auto locker = qt_scoped_lock(resourceMutex());
    if (version >= 0x01 && version <= 0x3) {
        QResourceRoot res(version, tree, name, data);
        ResourceList *list = resourceList();
        for (int i = 0; i < list->size();) {
            if (*list->at(i) == res) {
                QResourceRoot *root = list->takeAt(i);
                if (!root->ref.deref())
                    delete root;
            } else {
                ++i;
            }
        }
        return true;
    }
    return false;
}